

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O2

int ecdsa_sign_proxy(int type,uchar *m,int m_len,uchar *_sigret,uint *_siglen,BIGNUM *kinv,
                    BIGNUM *rp,EC_KEY *ec_key)

{
  undefined8 uVar1;
  int iVar2;
  void *__src;
  int *piVar3;
  char *fmt;
  size_t siglen;
  st_neverbleed_thread_data_t *thdata;
  st_neverbleed_rsa_exdata_t *exdata;
  expbuf_t local_68;
  size_t local_48;
  st_neverbleed_thread_data_t *local_40;
  st_neverbleed_rsa_exdata_t *local_38;
  
  local_68.end = (char *)0x0;
  local_68.capacity = 0;
  local_68.buf = (char *)0x0;
  local_68.start = (char *)0x0;
  ecdsa_get_privsep_data(ec_key,&local_38,&local_40);
  if (kinv == (BIGNUM *)0x0 && rp == (BIGNUM *)0x0) {
    expbuf_push_str(&local_68,"ecdsa_sign");
    expbuf_push_num(&local_68,(long)type);
    expbuf_push_bytes(&local_68,m,(long)m_len);
    expbuf_push_num(&local_68,local_38->key_index);
    iVar2 = expbuf_write(&local_68,local_40->fd);
    if (iVar2 == 0) {
      expbuf_dispose(&local_68);
      iVar2 = expbuf_read(&local_68,local_40->fd);
      if (iVar2 == 0) {
        if (7 < (ulong)((long)local_68.end - (long)local_68.start)) {
          uVar1 = *(undefined8 *)local_68.start;
          local_68.start = local_68.start + 8;
          __src = expbuf_shift_bytes(&local_68,&local_48);
          if (__src != (void *)0x0) {
            memcpy(_sigret,__src,local_48);
            *_siglen = (uint)local_48;
            expbuf_dispose(&local_68);
            return (int)uVar1;
          }
        }
        piVar3 = __errno_location();
        *piVar3 = 0;
        fmt = "failed to parse response";
        goto LAB_00182c8b;
      }
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      fmt = "read error";
    }
    else {
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      fmt = "write error";
    }
    if (iVar2 == 0) {
      fmt = "connection closed by daemon";
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0;
    fmt = "unexpected non-NULL kinv and rp";
  }
LAB_00182c8b:
  dief(fmt);
}

Assistant:

static int ecdsa_sign_proxy(int type, const unsigned char *m, int m_len, unsigned char *_sigret, unsigned int *_siglen,
                            const BIGNUM *kinv, const BIGNUM *rp, EC_KEY *ec_key)
{
    struct st_neverbleed_rsa_exdata_t *exdata;
    struct st_neverbleed_thread_data_t *thdata;
    struct expbuf_t buf = {};
    size_t ret, siglen;
    unsigned char *sigret;

    ecdsa_get_privsep_data(ec_key, &exdata, &thdata);

    /* as far as I've tested so far, kinv and rp are always NULL.
       Looks like setup_sign will precompute this, but it is only
       called sign_sig, and it seems to be not used in TLS ECDSA */
    if (kinv != NULL || rp != NULL) {
        errno = 0;
        dief("unexpected non-NULL kinv and rp");
    }

    expbuf_push_str(&buf, "ecdsa_sign");
    expbuf_push_num(&buf, type);
    expbuf_push_bytes(&buf, m, m_len);
    expbuf_push_num(&buf, exdata->key_index);
    if (expbuf_write(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "write error" : "connection closed by daemon");
    expbuf_dispose(&buf);

    if (expbuf_read(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "read error" : "connection closed by daemon");
    if (expbuf_shift_num(&buf, &ret) != 0 || (sigret = expbuf_shift_bytes(&buf, &siglen)) == NULL) {
        errno = 0;
        dief("failed to parse response");
    }
    memcpy(_sigret, sigret, siglen);
    *_siglen = (unsigned)siglen;
    expbuf_dispose(&buf);

    return (int)ret;
}